

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::OutputCountShader::OutputCountShader
          (OutputCountShader *this,ContextType *contextType,OutputCountPatternSpec *spec)

{
  ShaderProgramDeclaration *pSVar1;
  size_t sVar2;
  size_type sVar3;
  string local_318;
  GeometrySource local_2f8;
  GeometryShaderDeclaration local_2d8;
  allocator<char> local_2b9;
  string local_2b8;
  string local_298;
  FragmentSource local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  VertexSource local_210;
  FragmentOutput local_1f0;
  GeometryToFragmentVarying local_1ec;
  VertexToGeometryVarying local_1e4;
  allocator<char> local_1d9;
  string local_1d8;
  VertexAttribute local_1b8;
  allocator<char> local_179;
  string local_178;
  VertexAttribute local_158;
  ShaderProgramDeclaration local_130;
  OutputCountPatternSpec *local_20;
  OutputCountPatternSpec *spec_local;
  ContextType *contextType_local;
  OutputCountShader *this_local;
  
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_032ad868;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_032ad8a0;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032ad8b8;
  local_20 = spec;
  spec_local = (OutputCountPatternSpec *)contextType;
  contextType_local = (ContextType *)this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"a_position",&local_179);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_158,&local_178,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_130,&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"a_color",&local_1d9);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_1b8,&local_1d8,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1b8);
  sglr::pdec::VertexToGeometryVarying::VertexToGeometryVarying(&local_1e4,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1e4);
  sglr::pdec::GeometryToFragmentVarying::GeometryToFragmentVarying
            (&local_1ec,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1ec);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_1f0,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_geom_FragColor;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n\tv_geom_FragColor = a_color;\n}\n"
             ,&local_251);
  specializeShader(&local_230,&local_250,(ContextType *)spec_local);
  sglr::pdec::VertexSource::VertexSource(&local_210,&local_230);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
             ,&local_2b9);
  specializeShader(&local_298,&local_2b8,(ContextType *)spec_local);
  sglr::pdec::FragmentSource::FragmentSource(&local_278,&local_298);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_278);
  sVar2 = getPatternEmitCount(this,local_20);
  sglr::pdec::GeometryShaderDeclaration::GeometryShaderDeclaration
            (&local_2d8,GEOMETRYSHADERINPUTTYPE_POINTS,GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP,sVar2
             ,1);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2d8);
  Functional::(anonymous_namespace)::OutputCountShader::genGeometrySource_abi_cxx11_
            (&local_318,(OutputCountShader *)this,(ContextType *)spec_local,local_20);
  sglr::pdec::GeometrySource::GeometrySource(&local_2f8,&local_318);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2f8);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  sglr::pdec::GeometrySource::~GeometrySource(&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  sglr::pdec::FragmentSource::~FragmentSource(&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  sglr::pdec::VertexSource::~VertexSource(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_130);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_032ad868;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_032ad8a0;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032ad8b8;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_20->pattern);
  *(int *)&(this->super_ShaderProgram).field_0x154 = (int)sVar3;
  sVar2 = getPatternEmitCount(this,local_20);
  this->m_patternMaxEmitCount = (int)sVar2;
  OutputCountPatternSpec::OutputCountPatternSpec(&this->m_spec,local_20);
  return;
}

Assistant:

OutputCountShader::OutputCountShader (const glu::ContextType& contextType, const OutputCountPatternSpec& spec)
	: sglr::ShaderProgram	(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_color", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToGeometryVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::GeometryToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource(specializeShader(s_commonShaderSourceVertex, contextType))
							<< sglr::pdec::FragmentSource(specializeShader(s_commonShaderSourceFragment, contextType))
							<< sglr::pdec::GeometryShaderDeclaration(rr::GEOMETRYSHADERINPUTTYPE_POINTS, rr::GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP, getPatternEmitCount(spec))
							<< sglr::pdec::GeometrySource(genGeometrySource(contextType, spec)))
	, m_patternLength		((int)spec.pattern.size())
	, m_patternMaxEmitCount	((int)getPatternEmitCount(spec))
	, m_spec				(spec)
{
}